

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void TrueMotion_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top,int size)

{
  ulong uVar1;
  byte bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [11];
  undefined1 auVar21 [13];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  long lVar26;
  short sVar27;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 auVar28 [16];
  short sVar35;
  undefined1 auVar36 [16];
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  
  if (left == (uint8_t *)0x0) {
    if (top != (uint8_t *)0x0) {
      VerticalPred_SSE2(dst,top,size);
      return;
    }
    Fill_SSE2(dst,0x81,size);
    return;
  }
  if (top != (uint8_t *)0x0) {
    if (size == 8) {
      uVar1 = *(ulong *)top;
      auVar3._8_6_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3[0xe] = (char)(uVar1 >> 0x38);
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar1;
      auVar5[0xc] = (char)(uVar1 >> 0x30);
      auVar5._13_2_ = auVar3._13_2_;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar1;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9._8_2_ = 0;
      auVar9._0_8_ = uVar1;
      auVar9[10] = (char)(uVar1 >> 0x28);
      auVar9._11_4_ = auVar7._11_4_;
      auVar11._8_2_ = 0;
      auVar11._0_8_ = uVar1;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = (char)(uVar1 >> 0x20);
      auVar13._0_8_ = uVar1;
      auVar13._9_6_ = auVar11._9_6_;
      auVar15._7_8_ = 0;
      auVar15._0_7_ = auVar13._8_7_;
      Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),(char)(uVar1 >> 0x18));
      auVar22._9_6_ = 0;
      auVar22._0_9_ = Var16;
      auVar17._1_10_ = SUB1510(auVar22 << 0x30,5);
      auVar17[0] = (char)(uVar1 >> 0x10);
      auVar23._11_4_ = 0;
      auVar23._0_11_ = auVar17;
      auVar18._1_12_ = SUB1512(auVar23 << 0x20,3);
      auVar18[0] = (char)(uVar1 >> 8);
      bVar2 = left[-1];
      for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
        auVar28 = pshuflw(ZEXT416((uint)left[lVar26] - (uint)bVar2),
                          ZEXT416((uint)left[lVar26] - (uint)bVar2),0);
        sVar34 = auVar28._0_2_;
        sVar27 = sVar34 + (ushort)(byte)uVar1;
        sVar35 = auVar28._2_2_;
        sVar29 = sVar35 + auVar18._0_2_;
        sVar30 = sVar34 + auVar17._0_2_;
        sVar31 = sVar35 + (short)Var16;
        sVar32 = sVar34 + auVar13._8_2_;
        sVar33 = sVar35 + auVar9._10_2_;
        sVar34 = sVar34 + auVar5._12_2_;
        sVar35 = sVar35 + (auVar3._13_2_ >> 8);
        *(ulong *)dst =
             CONCAT17((0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35),
                      CONCAT16((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34),
                               CONCAT15((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 -
                                        (0xff < sVar33),
                                        CONCAT14((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 -
                                                 (0xff < sVar32),
                                                 CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                          (char)sVar31 - (0xff < sVar31),
                                                          CONCAT12((0 < sVar30) * (sVar30 < 0x100) *
                                                                   (char)sVar30 - (0xff < sVar30),
                                                                   CONCAT11((0 < sVar29) *
                                                                            (sVar29 < 0x100) *
                                                                            (char)sVar29 -
                                                                            (0xff < sVar29),
                                                                            (0 < sVar27) *
                                                                            (sVar27 < 0x100) *
                                                                            (char)sVar27 -
                                                                            (0xff < sVar27))))))));
        dst = dst + 0x20;
      }
    }
    else {
      auVar28 = *(undefined1 (*) [16])top;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar28._0_13_;
      auVar4[0xe] = auVar28[7];
      auVar6[0xc] = auVar28[6];
      auVar6._0_12_ = auVar28._0_12_;
      auVar6._13_2_ = auVar4._13_2_;
      auVar8[0xb] = 0;
      auVar8._0_11_ = auVar28._0_11_;
      auVar8._12_3_ = auVar6._12_3_;
      auVar10[10] = auVar28[5];
      auVar10._0_10_ = auVar28._0_10_;
      auVar10._11_4_ = auVar8._11_4_;
      auVar12[9] = 0;
      auVar12._0_9_ = auVar28._0_9_;
      auVar12._10_5_ = auVar10._10_5_;
      auVar14[8] = auVar28[4];
      auVar14._0_8_ = auVar28._0_8_;
      auVar14._9_6_ = auVar12._9_6_;
      auVar19._7_8_ = 0;
      auVar19._0_7_ = auVar14._8_7_;
      Var16 = CONCAT81(SUB158(auVar19 << 0x40,7),auVar28[3]);
      auVar24._9_6_ = 0;
      auVar24._0_9_ = Var16;
      auVar20._1_10_ = SUB1510(auVar24 << 0x30,5);
      auVar20[0] = auVar28[2];
      auVar25._11_4_ = 0;
      auVar25._0_11_ = auVar20;
      auVar21._1_12_ = SUB1512(auVar25 << 0x20,3);
      auVar21[0] = auVar28[1];
      bVar2 = left[-1];
      for (lVar26 = 0; lVar26 != 0x10; lVar26 = lVar26 + 1) {
        auVar36 = pshuflw(ZEXT416((uint)left[lVar26] - (uint)bVar2),
                          ZEXT416((uint)left[lVar26] - (uint)bVar2),0);
        sVar32 = auVar36._0_2_;
        sVar37 = sVar32 + (ushort)auVar28[0];
        sVar33 = auVar36._2_2_;
        sVar38 = sVar33 + auVar21._0_2_;
        sVar39 = sVar32 + auVar20._0_2_;
        sVar40 = sVar33 + (short)Var16;
        sVar41 = sVar32 + auVar14._8_2_;
        sVar42 = sVar33 + auVar10._10_2_;
        sVar43 = sVar32 + auVar6._12_2_;
        sVar44 = sVar33 + (auVar4._13_2_ >> 8);
        sVar34 = sVar32 + (ushort)auVar28[8];
        sVar27 = sVar33 + (ushort)auVar28[9];
        sVar35 = sVar32 + (ushort)auVar28[10];
        sVar29 = sVar33 + (ushort)auVar28[0xb];
        sVar30 = sVar32 + (ushort)auVar28[0xc];
        sVar31 = sVar33 + (ushort)auVar28[0xd];
        sVar32 = sVar32 + (ushort)auVar28[0xe];
        sVar33 = sVar33 + (ushort)auVar28[0xf];
        *dst = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        dst[1] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
        dst[2] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
        dst[3] = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
        dst[4] = (0 < sVar41) * (sVar41 < 0x100) * (char)sVar41 - (0xff < sVar41);
        dst[5] = (0 < sVar42) * (sVar42 < 0x100) * (char)sVar42 - (0xff < sVar42);
        dst[6] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
        dst[7] = (0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44);
        dst[8] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        dst[9] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
        dst[10] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        dst[0xb] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        dst[0xc] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        dst[0xd] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        dst[0xe] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        dst[0xf] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        dst = dst + 0x20;
      }
    }
    return;
  }
  HorizontalPred_SSE2(dst,left,size);
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion_SSE2(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const __m128i zero = _mm_setzero_si128();
  int y;
  if (size == 4) {
    const __m128i top_values = _mm_cvtsi32_si128(WebPMemToInt32(top));
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 4; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      WebPInt32ToMem(dst, _mm_cvtsi128_si32(out));
    }
  } else if (size == 8) {
    const __m128i top_values = _mm_loadl_epi64((const __m128i*)top);
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 8; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      _mm_storel_epi64((__m128i*)dst, out);
    }
  } else {
    const __m128i top_values = _mm_loadu_si128((const __m128i*)top);
    const __m128i top_base_0 = _mm_unpacklo_epi8(top_values, zero);
    const __m128i top_base_1 = _mm_unpackhi_epi8(top_values, zero);
    for (y = 0; y < 16; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out_0 = _mm_add_epi16(base, top_base_0);
      const __m128i out_1 = _mm_add_epi16(base, top_base_1);
      const __m128i out = _mm_packus_epi16(out_0, out_1);
      _mm_storeu_si128((__m128i*)dst, out);
    }
  }
}